

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringWriterTests.cpp
# Opt level: O0

string * readFileAndDelete_abi_cxx11_(char *fileName)

{
  streambuf *psVar1;
  char *in_RSI;
  string *in_RDI;
  stringstream written;
  ifstream in;
  string *text;
  stringstream local_3a0 [16];
  undefined1 local_390 [376];
  undefined1 local_218 [520];
  char *local_10;
  
  local_10 = in_RSI;
  std::ifstream::ifstream(local_218,in_RSI,_S_in);
  std::__cxx11::stringstream::stringstream(local_3a0);
  psVar1 = (streambuf *)std::ifstream::rdbuf();
  std::ostream::operator<<(local_390,psVar1);
  std::ifstream::close();
  remove(local_10);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_3a0);
  std::ifstream::~ifstream(local_218);
  return in_RDI;
}

Assistant:

std::string readFileAndDelete(const char* fileName)
{
    std::ifstream in(fileName, std::ios_base::in);
    std::stringstream written;
    written << in.rdbuf();
    in.close();
    remove(fileName);

    std::string text = written.str();
    return text;
}